

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O0

Vector<double,_4> *
tcu::mix<4>(Vector<double,_4> *__return_storage_ptr__,Vector<double,_4> *x,Vector<double,_4> *y,
           double a)

{
  double dVar1;
  int local_2c;
  int i;
  double a_local;
  Vector<double,_4> *y_local;
  Vector<double,_4> *x_local;
  Vector<double,_4> *res;
  
  Vector<double,_4>::Vector(__return_storage_ptr__);
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    dVar1 = deMix(x->m_data[local_2c],y->m_data[local_2c],a);
    __return_storage_ptr__->m_data[local_2c] = dVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<double, Size> mix (const Vector<double, Size>& x, const Vector<double, Size>& y, double a)
{
	Vector<double, Size> res;
	for (int i = 0; i < Size; i++)
		res.m_data[i] = deMix(x.m_data[i], y.m_data[i], a);
	return res;
}